

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.h
# Opt level: O0

size_t __thiscall PostAggRegTuple_hash::operator()(PostAggRegTuple_hash *this,PostAggRegTuple *key)

{
  size_t sVar1;
  unsigned_long *in_RSI;
  size_t h;
  hash<unsigned_long> local_1c;
  hash<unsigned_long> local_1b;
  hash<unsigned_long> local_1a;
  hash<unsigned_long> local_19;
  ulong local_18;
  unsigned_long *local_10;
  
  local_18 = 0;
  local_10 = in_RSI;
  sVar1 = std::hash<unsigned_long>::operator()(&local_19,*in_RSI);
  local_18 = sVar1 + 0x9e3779b9 + local_18 * 0x40 + (local_18 >> 2) ^ local_18;
  sVar1 = std::hash<unsigned_long>::operator()(&local_1a,local_10[1]);
  local_18 = sVar1 + 0x9e3779b9 + local_18 * 0x40 + (local_18 >> 2) ^ local_18;
  sVar1 = std::hash<unsigned_long>::operator()(&local_1b,local_10[2]);
  local_18 = sVar1 + 0x9e3779b9 + local_18 * 0x40 + (local_18 >> 2) ^ local_18;
  sVar1 = std::hash<unsigned_long>::operator()(&local_1c,local_10[3]);
  return sVar1 + 0x9e3779b9 + local_18 * 0x40 + (local_18 >> 2) ^ local_18;
}

Assistant:

size_t operator()(const PostAggRegTuple &key ) const
    {
        size_t h = 0;
        h ^= std::hash<size_t>()(key.local.first)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.local.second)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.post.first)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.post.second)+ 0x9e3779b9 + (h<<6) + (h>>2);
        return h;
    }